

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

Index __thiscall
PlanningUnitMADPDiscrete::GetActionObservationHistoryIndex
          (PlanningUnitMADPDiscrete *this,Index agentI,Index t,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *actions,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *observations)

{
  Index IVar1;
  undefined4 uVar2;
  const_reference pvVar3;
  reference pvVar4;
  uint in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  Index ts;
  vector<unsigned_int,_std::allocator<unsigned_int>_> AO_Is;
  size_t nrAO;
  size_t nrO;
  size_t nrA;
  size_t first_AOHI;
  undefined4 in_stack_ffffffffffffff48;
  Index in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  Index in_stack_ffffffffffffff60;
  value_type in_stack_ffffffffffffff64;
  const_reference in_stack_ffffffffffffff68;
  PlanningUnitMADPDiscrete *in_stack_ffffffffffffff70;
  uint local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  long local_40;
  size_t local_38;
  size_t local_30;
  ulong local_28;
  uint local_10;
  undefined4 local_c;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::at((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
        *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  pvVar3 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::at
                     ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  IVar1 = Globals::CastLIndexToIndex(*pvVar3);
  local_28 = (ulong)IVar1;
  local_30 = (**(code **)(*in_RDI + 0x38))(in_RDI,local_c);
  local_38 = GetNrObservations((PlanningUnitMADPDiscrete *)
                               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                               in_stack_ffffffffffffff4c);
  local_40 = local_30 * local_38;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x9d6af4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff70,
             (size_type)in_stack_ffffffffffffff68,
             (value_type_conflict1 *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x9d6b19);
  for (local_70 = 0; local_70 < local_10; local_70 = local_70 + 1) {
    in_stack_ffffffffffffff70 =
         (PlanningUnitMADPDiscrete *)
         std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                    CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    in_stack_ffffffffffffff64 =
         *(value_type *)
          &(((_Vector_impl *)&(in_stack_ffffffffffffff70->super_PlanningUnit)._vptr_PlanningUnit)->
           super__Vector_impl_data)._M_start;
    in_stack_ffffffffffffff68 =
         std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                    CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    in_stack_ffffffffffffff60 =
         IndexTools::ActionAndObservation_to_ActionObservationIndex
                   (in_stack_ffffffffffffff64,*in_stack_ffffffffffffff68,local_30,local_38);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_58,(ulong)local_70);
    *pvVar4 = in_stack_ffffffffffffff60;
  }
  uVar2 = (undefined4)local_28;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_58,0);
  IVar1 = ComputeHistoryIndex(in_stack_ffffffffffffff70,
                              (Index)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                              (Index)in_stack_ffffffffffffff68,
                              (Index *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                              ,CONCAT44(in_stack_ffffffffffffff5c,uVar2));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  return IVar1;
}

Assistant:

Index PlanningUnitMADPDiscrete::GetActionObservationHistoryIndex(
        Index agentI, 
        Index t, 
        const vector<Index>& actions,
        const vector<Index>& observations
        ) const
{
    //functioning is the same as for observation histories: only now the 
    //base is the nr AO.

    //-> first convert to AO indices:
    size_t first_AOHI=CastLIndexToIndex(_m_firstAOHIforT.at(agentI).at(t));
    size_t nrA = GetNrActions(agentI);
    size_t nrO = GetNrObservations(agentI);
    size_t nrAO = nrA * nrO;
    vector<Index> AO_Is(t, 0);
    for (Index ts=0; ts<t; ts++)
        AO_Is[ts] =  IndexTools::ActionAndObservation_to_ActionObservationIndex(
                    actions.at(ts), observations.at(ts), nrA, nrO);
    return( ComputeHistoryIndex(
                t, 
                first_AOHI,
                &AO_Is[0],
                nrAO
                )
          );    

    /*for (Index ts=0; ts<t; ts++)
    {
        int exponent = t-1 - ts;
        size_t b = (size_t) pow((double)nrAO, (double)(exponent));
        Index this_t_ao = IndexTools::
            ActionAndObservation_to_ActionObservationIndex(
                    actions.at(ts), observations.at(ts), nrA, nrO);
        this_AOHI += this_t_ao * b;
    }
    return(this_AOHI);*/
}